

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall capnp::JsonCodec::handleByAnnotation(JsonCodec *this,Schema schema)

{
  short sVar1;
  Impl *pIVar2;
  Entry *pEVar3;
  undefined8 uVar4;
  StructSchema SVar5;
  SegmentReader *pSVar6;
  ArrayPtr<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry>
  table;
  bool success;
  Vector<capnp::Schema> dependencies;
  EnumSchema enumSchema;
  size_t pos;
  undefined1 local_f1;
  Schema local_f0;
  undefined1 local_e8 [56];
  anon_union_8_2_eba6ea51_for_Type_5 local_b0;
  Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t> local_a8;
  WirePointer local_98;
  Entry local_90;
  Maybe<kj::StringPtr> local_70;
  Maybe<capnp::json::DiscriminatorOptions::Reader> local_58;
  
  local_f0.raw = schema.raw;
  Schema::getProto((Reader *)local_e8,&local_f0);
  if (0x6f < (uint)local_e8._32_4_) {
    sVar1 = *(short *)((long)&(((Vector<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry>
                                 *)local_e8._16_8_)->builder).pos + 4);
    if (sVar1 == 2) {
      local_b0 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asEnum(&local_f0);
      pIVar2 = (this->impl).ptr;
      pEVar3 = (pIVar2->annotatedEnumHandlers).table.rows.builder.ptr;
      local_98 = (WirePointer)
                 ((long)(pIVar2->annotatedEnumHandlers).table.rows.builder.pos - (long)pEVar3 >> 5);
      table.size_ = (size_t)pEVar3;
      table.ptr = (Entry *)&(pIVar2->annotatedEnumHandlers).table.indexes;
      kj::
      HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Callbacks>
      ::
      insert<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Entry,capnp::EnumSchema&>
                ((HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Callbacks>
                  *)local_e8,table,(size_t)local_98,(EnumSchema *)local_98);
      if (local_e8[0] ==
          (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Callbacks>
           )0x0) {
        local_e8._8_8_ = &local_f1;
        local_f1 = 0;
        local_e8[0] = (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Callbacks>
                       )0x1;
        local_e8._24_8_ = &local_98;
        local_e8._16_8_ = &pIVar2->annotatedEnumHandlers;
        local_e8._32_8_ = &local_b0;
        kj::heap<capnp::JsonCodec::AnnotatedEnumHandler,capnp::EnumSchema&>
                  ((kj *)&local_a8,(EnumSchema *)&local_b0);
        addTypeHandler(this,(EnumSchema)local_b0,
                       &(local_a8.ptr)->super_Handler<capnp::DynamicEnum,_(capnp::Style)0>);
        local_90.key.baseType = ENUM;
        local_90.key.listDepth = '\0';
        local_90.key.field_4 = local_b0;
        local_90.value.disposer = local_a8.disposer;
        local_90.value.ptr = local_a8.ptr;
        local_a8.ptr = (AnnotatedEnumHandler *)0x0;
        kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>::dispose(&local_a8);
        kj::
        Vector<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Entry>
        ::
        add<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Entry>
                  ((Vector<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Entry>
                    *)&pIVar2->annotatedEnumHandlers,&local_90);
        kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>::dispose(&local_90.value);
        local_f1 = 1;
        kj::_::
        Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:615:7)>
        ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:615:7)>
                     *)local_e8);
      }
    }
    else if (sVar1 == 1) {
      Schema::getProto((Reader *)local_e8,&local_f0);
      if (((uint)local_e8._32_4_ < 0x40) ||
         ((((Vector<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry>
             *)local_e8._16_8_)->builder).ptr != (Entry *)0xa3fa7845f919dd83)) {
        local_e8._16_8_ =
             (Table<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Callbacks>_>
              *)0x0;
        local_e8._0_8_ = (SegmentReader *)0x0;
        local_e8._8_8_ = (SegmentReader *)0x0;
        local_e8._24_8_ = &kj::NullArrayDisposer::instance;
        SVar5 = Schema::asStruct(&local_f0);
        local_58.ptr.isSet = false;
        local_70.ptr.isSet = false;
        loadAnnotatedHandler(this,SVar5,&local_58,&local_70,(Vector<capnp::Schema> *)local_e8);
        uVar4 = local_e8._8_8_;
        for (pSVar6 = (SegmentReader *)local_e8._0_8_; pSVar6 != (SegmentReader *)uVar4;
            pSVar6 = (SegmentReader *)&pSVar6->id) {
          handleByAnnotation(this,(RawBrandedSchema *)pSVar6->arena);
        }
        kj::ArrayBuilder<capnp::Schema>::dispose((ArrayBuilder<capnp::Schema> *)local_e8);
      }
      else {
        SVar5 = Schema::asStruct(&local_f0);
        addTypeHandler(this,SVar5,
                       &handleByAnnotation::GLOBAL_HANDLER.
                        super_Handler<capnp::DynamicStruct,_(capnp::Style)2>);
      }
    }
  }
  return;
}

Assistant:

void JsonCodec::handleByAnnotation(Schema schema) {
  switch (schema.getProto().which()) {
    case schema::Node::STRUCT: {
      if (schema.getProto().getId() == capnp::typeId<JsonValue>()) {
        // Special handler for JsonValue.
        static JsonValueHandler GLOBAL_HANDLER;
        addTypeHandler(schema.asStruct(), GLOBAL_HANDLER);
      } else {
        kj::Vector<Schema> dependencies;
        loadAnnotatedHandler(schema.asStruct(), kj::none, kj::none, dependencies);
        for (auto dep: dependencies) {
          handleByAnnotation(dep);
        }
      }
      break;
    }
    case schema::Node::ENUM: {
      auto enumSchema = schema.asEnum();
      impl->annotatedEnumHandlers.findOrCreate(enumSchema, [&]() {
        auto handler = kj::heap<AnnotatedEnumHandler>(enumSchema);
        addTypeHandler(enumSchema, *handler);
        return kj::HashMap<Type, kj::Own<AnnotatedEnumHandler>>::Entry {
            enumSchema, kj::mv(handler) };
      });
      break;
    }
    default:
      break;
  }
}